

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.c
# Opt level: O3

int lws_http_cookie_get(lws *wsi,char *name,char *buf,size_t *max_len)

{
  byte bVar1;
  allocated_headers *paVar2;
  char *pcVar3;
  int iVar4;
  size_t __n;
  ulong uVar5;
  byte bVar6;
  ulong uVar7;
  char cVar8;
  int iVar9;
  int iVar10;
  size_t sVar11;
  ulong uVar12;
  ulong uVar13;
  char *pcVar14;
  uint uVar15;
  
  sVar11 = *max_len;
  __n = strlen(name);
  paVar2 = (wsi->http).ah;
  if (paVar2 == (allocated_headers *)0x0) {
    return 1;
  }
  bVar1 = paVar2->frag_index[0x1a];
  uVar5 = (ulong)bVar1;
  if (uVar5 == 0) {
    if (__n != 0xffffffffffffffff) {
      return 1;
    }
    uVar15 = 0;
    uVar7 = 0;
  }
  else {
    uVar15 = 0;
    uVar7 = uVar5;
    do {
      uVar15 = uVar15 + paVar2->frags[uVar7].len;
      bVar6 = paVar2->frags[uVar7].nfrag;
      uVar7 = (ulong)bVar6;
    } while (bVar6 != 0);
    uVar7 = __n + 1;
    if (uVar15 < uVar7) {
      return 1;
    }
  }
  bVar6 = paVar2->frag_index[0x24];
  if (bVar6 != 0) {
    iVar9 = 0;
    do {
      iVar10 = (uint)paVar2->frags[bVar6].len + iVar9;
      bVar6 = paVar2->frags[bVar6].nfrag;
      iVar9 = (uint)(bVar6 != 0) + iVar10;
    } while (bVar6 != 0);
    if (iVar10 != 0) {
      if (bVar1 == 0) {
        return -1;
      }
      pcVar3 = paVar2->data;
      while (((uVar12 = (ulong)paVar2->frags[uVar5].len, uVar13 = uVar12 - uVar7, uVar12 < uVar7 ||
              (pcVar14 = pcVar3 + paVar2->frags[uVar5].offset, pcVar14[__n] != '=')) ||
             (iVar9 = bcmp(pcVar14,name,__n), iVar9 != 0))) {
        bVar1 = paVar2->frags[uVar5].nfrag;
        uVar5 = (ulong)bVar1;
        if (bVar1 == 0) {
          return -1;
        }
      }
      uVar5 = sVar11 - 1;
      if (uVar13 <= sVar11 - 1) {
        uVar5 = uVar13;
      }
      if (uVar5 != 0) {
        memcpy(buf,pcVar14 + __n + 1,uVar5);
      }
      *max_len = uVar5;
      buf[uVar5] = '\0';
      return 0;
    }
  }
  if (bVar1 == 0) {
    return 1;
  }
  pcVar3 = paVar2->data;
  if (pcVar3 == (char *)0x0) {
    return 1;
  }
  iVar10 = (int)__n;
  iVar9 = uVar15 - iVar10;
  if (iVar9 <= iVar10) {
    return 1;
  }
  uVar5 = (ulong)paVar2->frags[uVar5].offset;
  pcVar14 = pcVar3 + uVar5;
  uVar7 = __n & 0xffffffff;
  while ((pcVar3[__n + uVar5] != '=' || (iVar4 = bcmp(pcVar14,name,uVar7), iVar4 != 0))) {
    iVar9 = iVar9 + -1;
    __n = __n + 1;
    pcVar14 = pcVar14 + 1;
    if (iVar9 <= iVar10) {
      return 1;
    }
  }
  cVar8 = pcVar3[__n + 1 + uVar5];
  pcVar14 = buf;
  if (cVar8 != ';') {
    do {
      if ((uVar15 - 1 == (int)__n) || (sVar11 == 0)) break;
      *pcVar14 = cVar8;
      pcVar14 = pcVar14 + 1;
      sVar11 = sVar11 - 1;
      cVar8 = pcVar3[__n + uVar5 + 2];
      __n = __n + 1;
    } while (cVar8 != ';');
  }
  if (sVar11 != 0) {
    *pcVar14 = '\0';
    *max_len = (long)pcVar14 - (long)buf;
    return 0;
  }
  return 2;
}

Assistant:

int
lws_http_cookie_get(struct lws *wsi, const char *name, char *buf,
		    size_t *max_len)
{
	size_t max = *max_len, bl = strlen(name);
	char *p, *bo = buf;
	int n;

	n = lws_hdr_total_length(wsi, WSI_TOKEN_HTTP_COOKIE);
	if ((unsigned int)n < bl + 1)
		return 1;

	/*
	 * This can come to us two ways, in ah fragments (h2) or as a single
	 * semicolon-delimited string (h1)
	 */

#if defined(LWS_ROLE_H2)
	if (lws_hdr_total_length(wsi, WSI_TOKEN_HTTP_COLON_METHOD)) {

		/*
		 * The h2 way...
		 */

		int f = wsi->http.ah->frag_index[WSI_TOKEN_HTTP_COOKIE];
		size_t fl;

		while (f) {
			p = wsi->http.ah->data + wsi->http.ah->frags[f].offset;
			fl = (size_t)wsi->http.ah->frags[f].len;
			if (fl >= bl + 1 &&
			    p[bl] == '=' &&
			    !memcmp(p, name, bl)) {
				fl -= bl + 1;
				if (max - 1 < fl)
					fl = max - 1;
				if (fl)
					memcpy(buf, p + bl + 1, fl);
				*max_len = fl;
				buf[fl] = '\0';

				return 0;
			}
			f = wsi->http.ah->frags[f].nfrag;
		}

		return -1;
	}
#endif

	/*
	 * The h1 way...
	 */

	p = lws_hdr_simple_ptr(wsi, WSI_TOKEN_HTTP_COOKIE);
	if (!p)
		return 1;

	p += bl;
	n -= (int)bl;
	while (n-- > (int)bl) {
		if (*p == '=' && !memcmp(p - bl, name, (unsigned int)bl)) {
			p++;
			while (*p != ';' && n-- && max) {
				*buf++ = *p++;
				max--;
			}
			if (!max)
				return 2;

			*buf = '\0';
			*max_len = lws_ptr_diff_size_t(buf, bo);

			return 0;
		}
		p++;
	}

	return 1;
}